

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
JsTTDCreateContext(JsRuntimeHandle runtimeHandle,bool useRuntimeTTDMode,JsContextRef *newContext)

{
  code *pcVar1;
  bool bVar2;
  JsErrorCode JVar3;
  undefined4 *puVar4;
  JsrtRuntime *runtime;
  TTDRecorder local_58;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  bool inRecord;
  bool activelyRecording;
  bool inReplay;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (newContext == (JsContextRef *)0x0) {
    JVar3 = JsErrorNullArgument;
  }
  else if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar3 = JsErrorInvalidArgument;
  }
  else {
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    if (*(EventLog **)(*runtimeHandle + 0x16b8) == (EventLog *)0x0) {
      TTDAbort_unrecoverable_error("Need to create in TTD Mode.");
    }
    anon_var_0.m_staticAbortMessage._5_1_ = 0;
    anon_var_0.m_staticAbortMessage._6_1_ = 0;
    anon_var_0.m_staticAbortMessage._7_1_ = 0;
    local_58.m_actionEvent = (EventLogEntry *)0x0;
    local_58.m_resultPtr = (TTDVar *)0x0;
    if (useRuntimeTTDMode) {
      TTD::EventLog::GetModesForExplicitContextCreate
                (*(EventLog **)(*runtimeHandle + 0x16b8),
                 (bool *)((long)&anon_var_0.m_staticAbortMessage + 5),
                 (bool *)((long)&anon_var_0.m_staticAbortMessage + 6),
                 (bool *)((long)&anon_var_0.m_staticAbortMessage + 7));
    }
    JVar3 = CreateContextCore(runtimeHandle,&local_58,
                              (bool)(anon_var_0.m_staticAbortMessage._5_1_ & 1),
                              (bool)(anon_var_0.m_staticAbortMessage._6_1_ & 1),
                              (bool)(anon_var_0.m_staticAbortMessage._7_1_ & 1),newContext);
    if ((JVar3 - JsErrorNoCurrentContext < 7) &&
       ((0x43U >> (JVar3 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                         ,0x89,
                         "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                         ,
                         "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar3;
}

Assistant:

CHAKRA_API JsTTDCreateContext(_In_ JsRuntimeHandle runtimeHandle, _In_ bool useRuntimeTTDMode, _Out_ JsContextRef *newContext)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        PARAM_NOT_NULL(newContext);
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
        ThreadContext * threadContext = runtime->GetThreadContext();
        TTDAssert(threadContext->IsRuntimeInTTDMode(), "Need to create in TTD Mode.");

        bool inRecord = false;
        bool activelyRecording = false;
        bool inReplay = false;
        TTDRecorder dummyActionEntryPopper;
        if(useRuntimeTTDMode)
        {
            threadContext->TTDLog->GetModesForExplicitContextCreate(inRecord, activelyRecording, inReplay);
        }

        return CreateContextCore(runtimeHandle, dummyActionEntryPopper, inRecord, activelyRecording, inReplay, newContext);
    });
#endif
}